

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

int enableRawMode(int fd)

{
  int iVar1;
  int *piVar2;
  termios local_48;
  
  iVar1 = isatty(0);
  if (iVar1 != 0) {
    if (atexit_registered == '\0') {
      atexit(linenoiseAtExit);
      atexit_registered = '\x01';
    }
    iVar1 = tcgetattr(0,(termios *)&orig_termios);
    if (iVar1 != -1) {
      local_48.c_cc[7] = orig_termios.c_cc[7];
      local_48.c_cc[8] = orig_termios.c_cc[8];
      local_48.c_cc[9] = orig_termios.c_cc[9];
      local_48.c_cc[10] = orig_termios.c_cc[10];
      local_48.c_cc[0xb] = orig_termios.c_cc[0xb];
      local_48.c_cc[0xc] = orig_termios.c_cc[0xc];
      local_48.c_cc[0xd] = orig_termios.c_cc[0xd];
      local_48.c_cc[0xe] = orig_termios.c_cc[0xe];
      local_48.c_cc[0x1f] = orig_termios.c_cc[0x1f];
      local_48._49_3_ = orig_termios._49_3_;
      local_48.c_ispeed = orig_termios.c_ispeed;
      local_48.c_ospeed = orig_termios.c_ospeed;
      local_48.c_cc[0xf] = orig_termios.c_cc[0xf];
      local_48.c_cc[0x10] = orig_termios.c_cc[0x10];
      local_48.c_cc[0x11] = orig_termios.c_cc[0x11];
      local_48.c_cc[0x12] = orig_termios.c_cc[0x12];
      local_48.c_cc[0x13] = orig_termios.c_cc[0x13];
      local_48.c_cc[0x14] = orig_termios.c_cc[0x14];
      local_48.c_cc[0x15] = orig_termios.c_cc[0x15];
      local_48.c_cc[0x16] = orig_termios.c_cc[0x16];
      local_48.c_cc[0x17] = orig_termios.c_cc[0x17];
      local_48.c_cc[0x18] = orig_termios.c_cc[0x18];
      local_48.c_cc[0x19] = orig_termios.c_cc[0x19];
      local_48.c_cc[0x1a] = orig_termios.c_cc[0x1a];
      local_48.c_cc[0x1b] = orig_termios.c_cc[0x1b];
      local_48.c_cc[0x1c] = orig_termios.c_cc[0x1c];
      local_48.c_cc[0x1d] = orig_termios.c_cc[0x1d];
      local_48.c_cc[0x1e] = orig_termios.c_cc[0x1e];
      local_48.c_cflag = orig_termios.c_cflag;
      local_48.c_lflag = orig_termios.c_lflag;
      local_48._0_8_ = orig_termios._0_8_ & 0xfffffffefffffacd;
      local_48._8_8_ =
           CONCAT44(local_48.c_lflag,local_48.c_cflag | DAT_00139940._8_4_) & 0xffff7ff4ffffffff;
      local_48._16_6_ = orig_termios._16_6_;
      local_48.c_cc._5_2_ = 0x100;
      iVar1 = tcsetattr(0,2,&local_48);
      if (-1 < iVar1) {
        rawmode = 1;
        return 0;
      }
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x19;
  return -1;
}

Assistant:

static int enableRawMode(int fd) {
	struct termios raw;

	if (!isatty(STDIN_FILENO)) goto fatal;
	if (!atexit_registered) {
		atexit(linenoiseAtExit);
		atexit_registered = 1;
	}
	if (tcgetattr(fd,&orig_termios) == -1) goto fatal;

	raw = orig_termios;  /* modify the original mode */
	/* input modes: no break, no CR to NL, no parity check, no strip char,
	 * no start/stop output control. */
	raw.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
	/* output modes - disable post processing */
	raw.c_oflag &= ~(OPOST);
	/* control modes - set 8 bit chars */
	raw.c_cflag |= (CS8);
	/* local modes - choing off, canonical off, no extended functions,
	 * no signal chars (^Z,^C) */
	raw.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
	/* control chars - set return condition: min number of bytes and timer.
	 * We want read to return every single byte, without timeout. */
	raw.c_cc[VMIN] = 1; raw.c_cc[VTIME] = 0; /* 1 byte, no timer */

	/* put terminal in raw mode after flushing */
	if (tcsetattr(fd,TCSAFLUSH,&raw) < 0) goto fatal;
	rawmode = 1;
	return 0;

	fatal:
	errno = ENOTTY;
	return -1;
}